

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV3MeshNormalListBlock(Parser *this,Mesh *sMesh)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  Logger *pLVar4;
  reference pvVar5;
  undefined1 local_54 [8];
  aiVector3D vNormal_1;
  Face *face;
  aiVector3D vNormal;
  uint faceIdx;
  uint index;
  int local_1c;
  Mesh *pMStack_18;
  int iDepth;
  Mesh *sMesh_local;
  Parser *this_local;
  
  local_1c = 0;
  pMStack_18 = sMesh;
  sMesh_local = (Mesh *)this;
  sVar2 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                    (&(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&faceIdx,0.0,0.0,0.0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,sVar2 * 3,
             (value_type *)&faceIdx);
  vNormal.y = -NAN;
LAB_004943dd:
  do {
    while (*this->filePtr != '*') {
LAB_004945e4:
      if (*this->filePtr == '{') {
        local_1c = local_1c + 1;
      }
      else if (*this->filePtr == '}') {
        local_1c = local_1c + -1;
        if (local_1c == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_NORMALS chunk (Level 3)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    if ((vNormal.y != -NAN) &&
       (bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTEXNORMAL",0x11), bVar1)) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&face + 4));
      ParseLV4MeshFloatTriple(this,(ai_real *)((long)&face + 4),(uint *)&vNormal.z);
      uVar3 = (ulong)(uint)vNormal.y;
      sVar2 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                        (&(pMStack_18->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces);
      if (uVar3 < sVar2) {
        vNormal_1._4_8_ =
             std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                       (&(pMStack_18->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                        (ulong)(uint)vNormal.y);
        if (vNormal.z ==
            (float)(((reference)vNormal_1._4_8_)->super_FaceWithSmoothingGroup).mIndices[0]) {
          vNormal.z = 0.0;
        }
        else if (vNormal.z ==
                 (float)(((reference)vNormal_1._4_8_)->super_FaceWithSmoothingGroup).mIndices[1]) {
          vNormal.z = 1.4013e-45;
        }
        else {
          if (vNormal.z !=
              (float)(((reference)vNormal_1._4_8_)->super_FaceWithSmoothingGroup).mIndices[2]) {
            pLVar4 = DefaultLogger::get();
            Logger::error(pLVar4,"ASE: Invalid vertex index in MESH_VERTEXNORMAL section");
            goto LAB_004943dd;
          }
          vNormal.z = 2.8026e-45;
        }
        pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           (&(pMStack_18->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals
                            ,(ulong)(uint)((int)vNormal.y * 3 + (int)vNormal.z));
        aiVector3t<float>::operator+=(pvVar5,(aiVector3t<float> *)((long)&face + 4));
      }
      goto LAB_004943dd;
    }
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_FACENORMAL",0xf);
    if (!bVar1) goto LAB_004945e4;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_54);
    ParseLV4MeshFloatTriple(this,(ai_real *)local_54,(uint *)&vNormal.y);
    uVar3 = (ulong)(uint)vNormal.y;
    sVar2 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                      (&(pMStack_18->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces);
    if (uVar3 < sVar2) {
      pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (&(pMStack_18->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,
                          (ulong)(uint)((int)vNormal.y * 3));
      aiVector3t<float>::operator+=(pvVar5,(aiVector3t<float> *)local_54);
      pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (&(pMStack_18->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,
                          (ulong)((int)vNormal.y * 3 + 1));
      aiVector3t<float>::operator+=(pvVar5,(aiVector3t<float> *)local_54);
      pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (&(pMStack_18->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,
                          (ulong)((int)vNormal.y * 3 + 2));
      aiVector3t<float>::operator+=(pvVar5,(aiVector3t<float> *)local_54);
    }
    else {
      pLVar4 = DefaultLogger::get();
      Logger::error(pLVar4,"ASE: Invalid vertex index in MESH_FACENORMAL section");
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshNormalListBlock(ASE::Mesh& sMesh)
{
    AI_ASE_PARSER_INIT();

    // Allocate enough storage for the normals
    sMesh.mNormals.resize(sMesh.mFaces.size()*3,aiVector3D( 0.f, 0.f, 0.f ));
    unsigned int index, faceIdx = UINT_MAX;

    // FIXME: rewrite this and find out how to interpret the normals
    // correctly. This is crap.

    // Smooth the vertex and face normals together. The result
    // will be edgy then, but otherwise everything would be soft ...
    while (true)    {
        if ('*' == *filePtr)    {
            ++filePtr;
            if (faceIdx != UINT_MAX && TokenMatch(filePtr,"MESH_VERTEXNORMAL",17))  {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,index);
                if (faceIdx >=  sMesh.mFaces.size())
                    continue;

                // Make sure we assign it to the correct face
                const ASE::Face& face = sMesh.mFaces[faceIdx];
                if (index == face.mIndices[0])
                    index = 0;
                else if (index == face.mIndices[1])
                    index = 1;
                else if (index == face.mIndices[2])
                    index = 2;
                else    {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_VERTEXNORMAL section");
                    continue;
                }
                // We'll renormalize later
                sMesh.mNormals[faceIdx*3+index] += vNormal;
                continue;
            }
            if (TokenMatch(filePtr,"MESH_FACENORMAL",15))   {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,faceIdx);

                if (faceIdx >= sMesh.mFaces.size()) {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_FACENORMAL section");
                    continue;
                }

                // We'll renormalize later
                sMesh.mNormals[faceIdx*3] += vNormal;
                sMesh.mNormals[faceIdx*3+1] += vNormal;
                sMesh.mNormals[faceIdx*3+2] += vNormal;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_NORMALS");
    }
    return;
}